

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

void SUNDlsMat_AddIdentity(SUNDlsMat A)

{
  sunindextype i;
  SUNDlsMat A_local;
  
  if (A->type == 1) {
    for (i = 0; i < A->N; i = i + 1) {
      A->cols[i][i] = A->cols[i][i] + 1.0;
    }
  }
  else if (A->type == 2) {
    for (i = 0; i < A->M; i = i + 1) {
      A->cols[i][A->s_mu] = A->cols[i][A->s_mu] + 1.0;
    }
  }
  return;
}

Assistant:

void SUNDlsMat_AddIdentity(SUNDlsMat A)
{
  sunindextype i;

  switch (A->type)
  {
  case SUNDIALS_DENSE:
    for (i = 0; i < A->N; i++) { A->cols[i][i] += ONE; }
    break;

  case SUNDIALS_BAND:
    for (i = 0; i < A->M; i++) { A->cols[i][A->s_mu] += ONE; }
    break;
  }
}